

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O1

void run_CALL(WorkerP *w,Task *__dq_head)

{
  uint32_t uVar1;
  MDD MVar2;
  rel_t prVar3;
  int *piVar4;
  char *__s;
  uint uVar5;
  double dVar6;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *mtbdd;
  undefined1 mtbdd_00 [8];
  FILE *lddmc;
  FILE *pFVar7;
  size_t sVar8;
  void *__ptr;
  size_t sVar9;
  MTBDD MVar10;
  rel_t prVar11;
  undefined1 *puVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong __n;
  undefined1 *puVar20;
  int *piStack_e0;
  undefined1 auStack_d8 [16];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *local_c8;
  MTBDD new_initial;
  FILE *local_b8;
  MTBDD local_b0;
  MTBDD state_vars;
  rel_t local_a0;
  undefined1 local_98 [8];
  MTBDD new_states;
  MTBDD new_rel;
  uint local_80;
  int has_reachable;
  int action_labels_count;
  undefined4 uStack_74;
  uint32_t len;
  FILE *local_68;
  rel_t prStack_60;
  undefined8 local_58;
  MDD local_50;
  FILE *local_38;
  
  puVar20 = auStack_d8;
  puVar12 = auStack_d8;
  piStack_e0 = (int *)0x10546b;
  pFVar7 = fopen(model_filename,"rb");
  if (pFVar7 == (FILE *)0x0) goto LAB_00106177;
  piStack_e0 = (int *)0x105490;
  sVar8 = fread(&vector_size,4,1,pFVar7);
  puVar20 = auStack_d8;
  if (sVar8 != 1) goto LAB_0010617c;
  if (verbose == '\x01') {
    piStack_e0 = (int *)0x1054af;
    puts("Loading initial state.");
  }
  _action_labels_count = set_load_WRAP;
  _len = (_Worker *)0x1;
  piStack_e0 = (int *)0x1054d1;
  local_68 = pFVar7;
  lace_run_task((Task *)&action_labels_count);
  local_b8 = local_68;
  piStack_e0 = (int *)0x1054f5;
  sVar8 = fread(&next_count,4,1,pFVar7);
  puVar20 = auStack_d8;
  if (sVar8 != 1) goto LAB_00106181;
  piStack_e0 = (int *)0x10550f;
  next = (rel_t *)malloc((long)next_count << 3);
  if (verbose == '\x01') {
    piStack_e0 = (int *)0x10552b;
    puts("Loading transition relations.");
  }
  if (0 < next_count) {
    lVar15 = 0;
    do {
      _action_labels_count = rel_load_proj_WRAP;
      _len = (_Worker *)0x1;
      piStack_e0 = (int *)0x105556;
      local_68 = pFVar7;
      lace_run_task((Task *)&action_labels_count);
      next[lVar15] = (rel_t)local_68;
      lVar15 = lVar15 + 1;
    } while (lVar15 < next_count);
  }
  if (0 < next_count) {
    lVar15 = 0;
    do {
      prStack_60 = next[lVar15];
      _action_labels_count = rel_load_WRAP;
      _len = (_Worker *)0x1;
      piStack_e0 = (int *)0x1055b2;
      local_68 = pFVar7;
      lace_run_task((Task *)&action_labels_count);
      lVar15 = lVar15 + 1;
    } while (lVar15 < next_count);
  }
  new_rel._4_4_ = 0;
  piStack_e0 = (int *)0x1055dd;
  sVar8 = fread((void *)((long)&new_rel + 4),4,1,pFVar7);
  if (sVar8 != 1) goto LAB_00106186;
  puVar20 = auStack_d8;
  if (new_rel._4_4_ == 0) goto LAB_0010618b;
  if (verbose == '\x01') {
    piStack_e0 = (int *)0x105606;
    puts("Loading reachable states.");
  }
  _action_labels_count = set_load_WRAP;
  _len = (_Worker *)0x1;
  piStack_e0 = (int *)0x105621;
  local_68 = pFVar7;
  lace_run_task((Task *)&action_labels_count);
  state_vars = (MTBDD)local_68;
  local_80 = 0;
  piStack_e0 = (int *)0x105648;
  sVar8 = fread(&local_80,4,1,pFVar7);
  if (sVar8 != 1) {
    local_80 = 0;
  }
  uVar19 = (ulong)local_80;
  lVar15 = -(uVar19 * 8 + 0xf & 0xfffffffffffffff0);
  puVar20 = auStack_d8 + lVar15;
  auStack_d8._8_8_ = auStack_d8;
  new_initial = (MTBDD)puVar20;
  if (0 < (int)local_80) {
    uVar18 = 0;
    auStack_d8._8_8_ = auStack_d8;
    do {
      *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x10569a;
      sVar8 = fread(&action_labels_count,4,1,pFVar7);
      if (sVar8 != 1) {
LAB_0010616d:
        *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x106172;
        run_CALL_cold_4();
        goto LAB_00106172;
      }
      __n = (ulong)_action_labels_count & 0xffffffff;
      uVar13 = action_labels_count + 1;
      *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x1056b1;
      __ptr = malloc((ulong)uVar13);
      *(void **)(new_initial + uVar18 * 8) = __ptr;
      *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x1056d2;
      sVar8 = fread(__ptr,1,__n,pFVar7);
      if (sVar8 != __n) {
        *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x10616d;
        run_CALL_cold_5();
        goto LAB_0010616d;
      }
      *(undefined1 *)((long)__ptr + __n) = 0;
      uVar18 = uVar18 + 1;
    } while (uVar19 != uVar18);
  }
  *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x1056f0;
  fclose(pFVar7);
  *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x105705;
  printf("Read file %s.\n");
  if (verbose != '\0') {
    *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x10572c;
    printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
           (ulong)(uint)next_count);
    *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x105738;
    puts("LDD nodes:");
    MVar2 = *(MDD *)local_b8;
    *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x105747;
    lddmc_nodecount(MVar2);
    *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x105758;
    printf("Initial states: %zu LDD nodes\n");
    if (0 < next_count) {
      uVar19 = 0;
      do {
        MVar2 = next[uVar19]->dd;
        *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x10577e;
        sVar9 = lddmc_nodecount(MVar2);
        *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x10578e;
        printf("Transition %d: %zu LDD nodes\n",uVar19 & 0xffffffff,sVar9);
        uVar19 = uVar19 + 1;
      } while ((long)uVar19 < (long)next_count);
    }
  }
  if (verbose == '\x01') {
    *(undefined8 *)(auStack_d8 + lVar15 + -8) = 0x1057b2;
    puts("Preparing conversion to BDD...");
  }
  prVar11 = (rel_t)(puVar20 + -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    prVar11[-1].w_proj = (int *)0x1057df;
    memset(prVar11,0,(ulong)(uint)vector_size << 2);
  }
  local_68 = *(FILE **)state_vars;
  _action_labels_count = compute_highest_WRAP;
  _len = (_Worker *)0x1;
  prStack_60 = prVar11;
  prVar11[-1].w_proj = (int *)0x10580c;
  lace_run_task((Task *)&action_labels_count);
  has_reachable = 0;
  if (0 < next_count) {
    lVar15 = 0;
    do {
      local_68 = (FILE *)next[lVar15]->dd;
      prStack_60 = (rel_t)next[lVar15]->meta;
      _action_labels_count = compute_highest_action_WRAP;
      _len = (_Worker *)0x1;
      local_58 = &has_reachable;
      prVar11[-1].w_proj = (int *)0x105858;
      lace_run_task((Task *)&action_labels_count);
      lVar15 = lVar15 + 1;
    } while (lVar15 < next_count);
  }
  puVar20 = (undefined1 *)
            ((long)prVar11 - ((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    uVar19 = 0;
    do {
      *(undefined4 *)(puVar20 + uVar19 * 4) = 0;
      uVar13 = *(uint *)((long)&prVar11->dd + uVar19 * 4);
      if (uVar13 != 0) {
        uVar5 = 0x1f;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        iVar14 = (uVar5 ^ 0x1f) - 0x20;
        do {
          uVar13 = uVar13 >> 1;
          iVar14 = iVar14 + 1;
        } while (iVar14 != 0);
        *(uint *)(puVar20 + uVar19 * 4) = (*(int *)(puVar20 + uVar19 * 4) - (uVar5 ^ 0x1f)) + 0x20;
        *(uint *)((long)&prVar11->dd + uVar19 * 4) = uVar13;
      }
      *(uint *)(puVar20 + uVar19 * 4) =
           *(int *)(puVar20 + uVar19 * 4) + (uint)(*(int *)(puVar20 + uVar19 * 4) == 0);
      uVar19 = uVar19 + 1;
    } while (uVar19 != (uint)vector_size);
  }
  actionbits = 0;
  if (has_reachable != 0) {
    uVar13 = 0x1f;
    if (has_reachable != 0) {
      for (; (uint)has_reachable >> uVar13 == 0; uVar13 = uVar13 - 1) {
      }
    }
    actionbits = 0x20 - (uVar13 ^ 0x1f);
    iVar14 = (uVar13 ^ 0x1f) - 0x20;
    do {
      has_reachable = (uint)has_reachable >> 1;
      iVar14 = iVar14 + 1;
    } while (iVar14 != 0);
  }
  if ((actionbits == 0) && ((has_actions & 1) != 0)) {
    actionbits = 1;
  }
  if (verbose == '\x01') {
    *(undefined8 *)(puVar20 + -8) = 0x10592f;
    printf("Bits per level: ");
    if (0 < vector_size) {
      lVar15 = 0;
      do {
        if (lVar15 != 0) {
          *(undefined8 *)(puVar20 + -8) = 0x105958;
          printf(", ");
        }
        uVar13 = *(uint *)(puVar20 + lVar15 * 4);
        *(undefined8 *)(puVar20 + -8) = 0x105966;
        printf("%d",(ulong)uVar13);
        lVar15 = lVar15 + 1;
      } while (lVar15 < vector_size);
    }
    *(undefined8 *)(puVar20 + -8) = 0x10597f;
    putchar(10);
    *(undefined8 *)(puVar20 + -8) = 0x105993;
    printf("Action bits: %d.\n");
  }
  prVar11 = (rel_t)0x1;
  if (0 < vector_size) {
    iVar14 = 0;
    iVar17 = -1;
    do {
      uVar1 = *(uint32_t *)(puVar20 + (long)(vector_size + iVar17) * 4);
      *(undefined8 *)(puVar20 + -8) = 0x1059be;
      prVar11 = (rel_t)lddmc_makenode(uVar1,(MDD)prVar11,0);
      iVar14 = iVar14 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar14 < vector_size);
  }
  *(undefined8 *)(puVar20 + -8) = 0x1059d8;
  lddmc_ref((MDD)prVar11);
  if ((long)vector_size < 1) {
    iVar14 = 0;
  }
  else {
    lVar15 = 0;
    iVar14 = 0;
    do {
      iVar14 = iVar14 + *(int *)(puVar20 + lVar15 * 4);
      lVar15 = lVar15 + 1;
    } while (vector_size != lVar15);
  }
  local_b0 = 0x8000000000000000;
  if (0 < iVar14) {
    uVar1 = iVar14 * 2;
    iVar17 = iVar14;
    do {
      MVar10 = local_b0;
      uVar1 = uVar1 - 2;
      if (local_b0 == 0) {
        local_b0 = 0;
      }
      else {
        *(undefined8 *)(puVar20 + -8) = 0x105a2e;
        local_b0 = _mtbdd_makenode(uVar1,0,MVar10);
      }
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  *(undefined8 *)(puVar20 + -8) = 0x105a4e;
  mtbdd_protect(&local_b0);
  if (verbose != '\0') {
    *(undefined8 *)(puVar20 + -8) = 0x105a63;
    puts("Converting to BDD...");
  }
  local_a0 = prVar11;
  *(undefined8 *)(puVar20 + -8) = 0x105a7d;
  pFVar7 = fopen(bdd_filename,"w");
  local_38 = pFVar7;
  if (pFVar7 != (FILE *)0x0) {
    *(undefined8 *)(puVar20 + -8) = 0x105aa7;
    fwrite(&vector_size,4,1,pFVar7);
    *(undefined8 *)(puVar20 + -8) = 0x105abe;
    fwrite(puVar20,4,(long)vector_size,pFVar7);
    *(undefined8 *)(puVar20 + -8) = 0x105ad7;
    fwrite(&actionbits,4,1,pFVar7);
    pFVar7 = local_b8;
    local_68 = *(FILE **)local_b8;
    _action_labels_count = bdd_from_ldd_WRAP;
    _len = (_Worker *)0x1;
    prStack_60 = local_a0;
    local_58 = (int *)((ulong)local_58 & 0xffffffff00000000);
    *(undefined8 *)(puVar20 + -8) = 0x105b17;
    lace_run_task((Task *)&action_labels_count);
    local_c8 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)local_68;
    _action_labels_count = mtbdd_satcount_WRAP;
    _len = (_Worker *)0x1;
    prStack_60 = (rel_t)(long)iVar14;
    *(undefined8 *)(puVar20 + -8) = 0x105b47;
    lace_run_task((Task *)&action_labels_count);
    uVar19 = (ulong)(double)local_68;
    dVar6 = (double)local_68 - 9.223372036854776e+18;
    local_68 = *(FILE **)pFVar7;
    _action_labels_count = lddmc_satcount_cached_WRAP;
    _len = (_Worker *)0x1;
    *(undefined8 *)(puVar20 + -8) = 0x105b8e;
    lace_run_task((Task *)&action_labels_count);
    mtbdd = local_c8;
    if (((long)uVar19 >> 0x3f & (long)dVar6 | uVar19) ==
        ((long)(double)local_68 >> 0x3f & (long)((double)local_68 - 9.223372036854776e+18) |
        (long)(double)local_68)) {
      *(undefined8 *)(puVar20 + -8) = 0x105bcc;
      mtbdd_refs_push((MTBDD)mtbdd);
      pFVar7 = local_38;
      local_98._0_4_ = 0xffffffff;
      *(undefined8 *)(puVar20 + -8) = 0x105bf4;
      fwrite(local_98,4,1,pFVar7);
      _action_labels_count = mtbdd_writer_tobinary_WRAP;
      _len = (_Worker *)0x1;
      local_68 = pFVar7;
      local_58._0_1_ = '\x01';
      local_58._1_1_ = '\0';
      local_58._2_1_ = '\0';
      local_58._3_1_ = '\0';
      prStack_60 = (rel_t)&local_c8;
      *(undefined8 *)(puVar20 + -8) = 0x105c1e;
      lace_run_task((Task *)&action_labels_count);
      prVar11 = local_a0;
      MVar10 = state_vars;
      local_68 = *(FILE **)state_vars;
      _action_labels_count = bdd_from_ldd_WRAP;
      _len = (_Worker *)0x1;
      prStack_60 = local_a0;
      local_58 = (int *)((ulong)local_58._4_4_ << 0x20);
      *(undefined8 *)(puVar20 + -8) = 0x105c5a;
      lace_run_task((Task *)&action_labels_count);
      local_98 = (undefined1  [8])local_68;
      _action_labels_count = mtbdd_satcount_WRAP;
      _len = (_Worker *)0x1;
      prStack_60 = (rel_t)(long)iVar14;
      *(undefined8 *)(puVar20 + -8) = 0x105c84;
      lace_run_task((Task *)&action_labels_count);
      uVar19 = (ulong)(double)local_68;
      dVar6 = (double)local_68 - 9.223372036854776e+18;
      local_68 = *(FILE **)MVar10;
      _action_labels_count = lddmc_satcount_cached_WRAP;
      _len = (_Worker *)0x1;
      *(undefined8 *)(puVar20 + -8) = 0x105ccf;
      lace_run_task((Task *)&action_labels_count);
      mtbdd_00 = local_98;
      if (((long)uVar19 >> 0x3f & (long)dVar6 | uVar19) !=
          ((long)(double)local_68 >> 0x3f & (long)((double)local_68 - 9.223372036854776e+18) |
          (long)(double)local_68)) {
        *(code **)(puVar20 + -8) = main;
        __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                      ,0x2b2,"void run_WORK(WorkerP *, Task *)");
      }
      *(undefined8 *)(puVar20 + -8) = 0x105d0c;
      mtbdd_refs_push((MTBDD)mtbdd_00);
      if (verbose == '\x01') {
        _action_labels_count = local_c8;
        *(undefined8 *)(puVar20 + -8) = 0x105d2c;
        sVar9 = mtbdd_nodecount_more((MTBDD *)&action_labels_count,1);
        *(undefined8 *)(puVar20 + -8) = 0x105d3d;
        printf("Initial states: %zu BDD nodes\n",sVar9);
        _action_labels_count = (code *)local_98;
        *(undefined8 *)(puVar20 + -8) = 0x105d55;
        sVar9 = mtbdd_nodecount_more((MTBDD *)&action_labels_count,1);
        *(undefined8 *)(puVar20 + -8) = 0x105d66;
        printf("Reachable states: %zu BDD nodes\n",sVar9);
      }
      pFVar7 = local_38;
      *(undefined8 *)(puVar20 + -8) = 0x105d80;
      fwrite(&next_count,4,1,pFVar7);
      pFVar7 = local_38;
      if (0 < next_count) {
        lVar15 = 0;
        do {
          prVar3 = next[lVar15];
          *(undefined8 *)(puVar20 + -8) = 0x105db4;
          fwrite(&prVar3->r_k,4,1,pFVar7);
          prVar3 = next[lVar15];
          *(undefined8 *)(puVar20 + -8) = 0x105dd5;
          fwrite(&prVar3->w_k,4,1,pFVar7);
          piVar4 = next[lVar15]->r_proj;
          iVar14 = next[lVar15]->r_k;
          *(undefined8 *)(puVar20 + -8) = 0x105df5;
          fwrite(piVar4,4,(long)iVar14,pFVar7);
          piVar4 = next[lVar15]->w_proj;
          iVar14 = next[lVar15]->w_k;
          *(undefined8 *)(puVar20 + -8) = 0x105e15;
          fwrite(piVar4,4,(long)iVar14,pFVar7);
          lVar15 = lVar15 + 1;
        } while (lVar15 < next_count);
      }
      if (0 < next_count) {
        uVar19 = 0;
        do {
          local_68 = (FILE *)next[uVar19]->dd;
          local_50 = next[uVar19]->meta;
          _action_labels_count = bdd_from_ldd_rel_WRAP;
          _len = (_Worker *)0x1;
          local_58 = (int *)((ulong)local_58 & 0xffffffff00000000);
          prStack_60 = prVar11;
          *(undefined8 *)(puVar20 + -8) = 0x105e83;
          lace_run_task((Task *)&action_labels_count);
          pFVar7 = local_68;
          new_states = (MTBDD)local_68;
          *(undefined8 *)(puVar20 + -8) = 0x105e93;
          mtbdd_refs_push((MTBDD)pFVar7);
          _action_labels_count = mtbdd_writer_tobinary_WRAP;
          _len = (_Worker *)0x1;
          local_68 = local_38;
          local_58 = (int *)CONCAT44(local_58._4_4_,1);
          prStack_60 = (rel_t)&new_states;
          *(undefined8 *)(puVar20 + -8) = 0x105ec1;
          lace_run_task((Task *)&action_labels_count);
          if (verbose == '\x01') {
            _action_labels_count = (code *)new_states;
            *(undefined8 *)(puVar20 + -8) = 0x105ee2;
            sVar9 = mtbdd_nodecount_more((MTBDD *)&action_labels_count,1);
            *(undefined8 *)(puVar20 + -8) = 0x105ef6;
            printf("Transition %d: %zu BDD nodes\n",uVar19 & 0xffffffff,sVar9);
          }
          if (check_results == '\x01') {
            MVar2 = next[uVar19]->meta;
            *(undefined8 *)(puVar20 + -8) = 0x105f1f;
            MVar10 = meta_to_bdd(MVar2,(MDD)prVar11,0);
            *(undefined8 *)(puVar20 + -8) = 0x105f2d;
            mtbdd_refs_push(MVar10);
            _action_labels_count = sylvan_relnext_WRAP;
            _len = (_Worker *)0x1;
            local_68 = (FILE *)local_98;
            prStack_60 = (rel_t)new_states;
            local_50 = local_50 & 0xffffffff00000000;
            local_58 = (int *)MVar10;
            *(undefined8 *)(puVar20 + -8) = 0x105f67;
            lace_run_task((Task *)&action_labels_count);
            pFVar7 = local_68;
            *(undefined8 *)(puVar20 + -8) = 0x105f73;
            mtbdd_refs_push((MTBDD)pFVar7);
            local_68 = *(FILE **)state_vars;
            prStack_60 = (rel_t)next[uVar19]->dd;
            local_58 = (int *)next[uVar19]->meta;
            _action_labels_count = lddmc_relprod_WRAP;
            _len = (_Worker *)0x1;
            *(undefined8 *)(puVar20 + -8) = 0x105fb0;
            lace_run_task((Task *)&action_labels_count);
            lddmc = local_68;
            *(undefined8 *)(puVar20 + -8) = 0x105fbc;
            lddmc_refs_push((MDD)lddmc);
            _action_labels_count = bdd_from_ldd_WRAP;
            _len = (_Worker *)0x1;
            local_58 = (int *)((ulong)local_58 & 0xffffffff00000000);
            local_68 = lddmc;
            prStack_60 = prVar11;
            *(undefined8 *)(puVar20 + -8) = 0x105fe7;
            lace_run_task((Task *)&action_labels_count);
            if (pFVar7 != local_68) goto LAB_00106172;
            *(undefined8 *)(puVar20 + -8) = 0x105ffb;
            lddmc_refs_pop(1);
            *(undefined8 *)(puVar20 + -8) = 0x106005;
            mtbdd_refs_pop(2);
            prVar11 = local_a0;
          }
          *(undefined8 *)(puVar20 + -8) = 0x106024;
          mtbdd_refs_pop(1);
          uVar19 = uVar19 + 1;
        } while ((long)uVar19 < (long)next_count);
      }
      pFVar7 = local_38;
      if (no_reachable != '\0') {
        new_rel._4_4_ = 0;
      }
      *(undefined8 *)(puVar20 + -8) = 0x106061;
      fwrite((void *)((long)&new_rel + 4),4,1,pFVar7);
      pFVar7 = local_38;
      if (new_rel._4_4_ != 0) {
        new_states = CONCAT44(new_states._4_4_,0xffffffff);
        *(undefined8 *)(puVar20 + -8) = 0x106089;
        fwrite(&new_states,4,1,pFVar7);
        _action_labels_count = mtbdd_writer_tobinary_WRAP;
        _len = (_Worker *)0x1;
        local_68 = pFVar7;
        prStack_60 = (rel_t)local_98;
        local_58 = (int *)CONCAT44(local_58._4_4_,1);
        *(undefined8 *)(puVar20 + -8) = 0x1060ba;
        lace_run_task((Task *)&action_labels_count);
      }
      *(undefined8 *)(puVar20 + -8) = 0x1060c4;
      mtbdd_refs_pop(1);
      pFVar7 = local_38;
      *(undefined8 *)(puVar20 + -8) = 0x1060de;
      fwrite(&local_80,4,1,pFVar7);
      pFVar7 = local_38;
      MVar10 = new_initial;
      lVar15 = (long)(int)local_80;
      if (0 < lVar15) {
        lVar16 = 0;
        do {
          __s = *(char **)(MVar10 + lVar16 * 8);
          *(undefined8 *)(puVar20 + -8) = 0x106100;
          sVar8 = strlen(__s);
          _action_labels_count = (code *)CONCAT44(uStack_74,(int)sVar8);
          *(undefined8 *)(puVar20 + -8) = 0x106119;
          fwrite(&action_labels_count,4,1,pFVar7);
          uVar19 = (ulong)_action_labels_count & 0xffffffff;
          *(undefined8 *)(puVar20 + -8) = 0x10612c;
          fwrite(__s,1,uVar19,pFVar7);
          lVar16 = lVar16 + 1;
        } while (lVar15 != lVar16);
      }
      pFVar7 = local_38;
      *(undefined8 *)(puVar20 + -8) = 0x10613d;
      fclose(pFVar7);
      *(undefined8 *)(puVar20 + -8) = 0x106152;
      printf("Written file %s.\n",bdd_filename);
      return;
    }
    goto LAB_00106195;
  }
  goto LAB_00106190;
LAB_00106172:
  *(undefined8 *)(puVar20 + -8) = 0x106177;
  run_CALL_cold_6();
LAB_00106177:
  *(undefined8 *)(puVar20 + -8) = 0x10617c;
  run_CALL_cold_9();
LAB_0010617c:
  *(undefined8 *)(puVar20 + -8) = 0x106181;
  run_CALL_cold_1();
LAB_00106181:
  puVar12 = puVar20;
  *(undefined8 *)(puVar12 + -8) = 0x106186;
  run_CALL_cold_2();
LAB_00106186:
  *(undefined8 *)(puVar12 + -8) = 0x10618b;
  run_CALL_cold_3();
  puVar20 = puVar12;
LAB_0010618b:
  *(undefined8 *)(puVar20 + -8) = 0x106190;
  run_CALL_cold_8();
LAB_00106190:
  *(undefined8 *)(puVar20 + -8) = 0x106195;
  run_CALL_cold_7();
LAB_00106195:
  *(undefined8 *)(puVar20 + -8) = 0x1061b4;
  __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                ,0x2a8,"void run_WORK(WorkerP *, Task *)");
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}